

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgroupbox.cpp
# Opt level: O2

void __thiscall QGroupBox::setCheckable(QGroupBox *this,bool checkable)

{
  bool bVar1;
  QGroupBoxPrivate *this_00;
  undefined7 in_register_00000031;
  
  this_00 = *(QGroupBoxPrivate **)&(this->super_QWidget).field_0x8;
  bVar1 = this_00->checkable;
  this_00->checkable = checkable;
  if ((int)CONCAT71(in_register_00000031,checkable) == 0) {
    if (bVar1 != false) {
      QWidget::setFocusPolicy(&this->super_QWidget,NoFocus);
      QGroupBoxPrivate::_q_setChildrenEnabled(this_00,true);
      QWidget::updateGeometry(&this->super_QWidget);
    }
    QGroupBoxPrivate::_q_setChildrenEnabled(this_00,true);
  }
  else {
    setChecked(this,true);
    if (bVar1 == false) {
      QWidget::setFocusPolicy(&this->super_QWidget,StrongFocus);
      QGroupBoxPrivate::_q_setChildrenEnabled(this_00,true);
      QWidget::updateGeometry(&this->super_QWidget);
    }
  }
  if (bVar1 == checkable) {
    return;
  }
  QGroupBoxPrivate::calculateFrame(this_00);
  QWidget::update(&this->super_QWidget);
  return;
}

Assistant:

void QGroupBox::setCheckable(bool checkable)
{
    Q_D(QGroupBox);

    bool wasCheckable = d->checkable;
    d->checkable = checkable;

    if (checkable) {
        setChecked(true);
        if (!wasCheckable) {
            setFocusPolicy(Qt::StrongFocus);
            d->_q_setChildrenEnabled(true);
            updateGeometry();
        }
    } else {
        if (wasCheckable) {
            setFocusPolicy(Qt::NoFocus);
            d->_q_setChildrenEnabled(true);
            updateGeometry();
        }
        d->_q_setChildrenEnabled(true);
    }

    if (wasCheckable != checkable) {
        d->calculateFrame();
        update();
    }
}